

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoofft.c
# Opt level: O2

CURLofft curlx_strtoofft(char *str,char **endp,int base,curl_off_t *num)

{
  int iVar1;
  CURLofft CVar2;
  int *piVar3;
  long lVar4;
  char *end;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  *num = 0;
  do {
    if (*str == 0) {
LAB_0011d81f:
      lVar4 = strtol(str,&end,base);
      if (endp != (char **)0x0) {
        *endp = end;
      }
      if (*piVar3 == 0x22) {
        CVar2 = CURL_OFFT_FLOW;
      }
      else if (str == end) {
        CVar2 = CURL_OFFT_INVAL;
      }
      else {
        *num = lVar4;
        CVar2 = CURL_OFFT_OK;
      }
      return CVar2;
    }
    iVar1 = Curl_isspace((uint)(byte)*str);
    if (iVar1 == 0) {
      if (*str == 0x2d) {
        if (endp == (char **)0x0) {
          return CURL_OFFT_INVAL;
        }
        *endp = str;
        return CURL_OFFT_INVAL;
      }
      goto LAB_0011d81f;
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

CURLofft curlx_strtoofft(const char *str, char **endp, int base,
                         curl_off_t *num)
{
  char *end;
  curl_off_t number;
  errno = 0;
  *num = 0; /* clear by default */

  while(*str && ISSPACE(*str))
    str++;
  if('-' == *str) {
    if(endp)
      *endp = (char *)str; /* didn't actually move */
    return CURL_OFFT_INVAL; /* nothing parsed */
  }
  number = strtooff(str, &end, base);
  if(endp)
    *endp = end;
  if(errno == ERANGE)
    /* overflow/underflow */
    return CURL_OFFT_FLOW;
  else if(str == end)
    /* nothing parsed */
    return CURL_OFFT_INVAL;

  *num = number;
  return CURL_OFFT_OK;
}